

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTable::focusChild(QAccessibleTable *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QModelIndex index;
  QModelIndex *in_stack_ffffffffffffffc0;
  QAbstractItemView *this_00;
  QAccessibleInterface *local_28;
  QModelIndex *index_00;
  QAccessibleTable *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QAccessibleTable *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  view((QAccessibleTable *)0x7f57be);
  QAbstractItemView::currentIndex(this_00);
  bVar2 = QModelIndex::isValid(in_stack_ffffffffffffffc0);
  if (bVar2) {
    iVar3 = logicalIndex(this_01,index_00);
    local_28 = (QAccessibleInterface *)
               (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget
                           + 0x100))(in_RDI,iVar3);
  }
  else {
    local_28 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::focusChild() const
{
    QModelIndex index = view()->currentIndex();
    if (!index.isValid())
        return nullptr;

    return child(logicalIndex(index));
}